

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O3

int main(void)

{
  int n;
  PmError PVar1;
  int iVar2;
  int iVar3;
  PmQueue *q;
  long *msg2_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *__s;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar22;
  int iVar23;
  undefined1 auVar21 [16];
  int iVar24;
  long msg [100];
  long msg2 [100];
  ulong local_678 [100];
  long local_358 [101];
  long lVar18;
  
  uVar9 = 5;
  uVar7 = 4;
  while( true ) {
    __s = "Could not allocate queue";
    n = (int)uVar7;
    q = Pm_QueueCreate(100,n * 8);
    printf("msg_len = %d\n",uVar7 & 0xffffffff);
    if (q == (PmQueue *)0x0) goto LAB_00102f36;
    uVar6 = uVar9 & 0xfffffffffffffffe;
    puts("test 1");
    lVar18 = uVar7 - 1;
    auVar21._8_4_ = (int)lVar18;
    auVar21._0_8_ = lVar18;
    auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar5 = 0;
    auVar21 = auVar21 ^ _DAT_00106020;
    do {
      uVar4 = 0;
      auVar11 = _DAT_00106010;
      do {
        auVar19 = auVar11 ^ _DAT_00106020;
        iVar20 = auVar21._0_4_;
        iVar22 = auVar21._4_4_;
        iVar23 = auVar21._8_4_;
        iVar24 = auVar21._12_4_;
        if ((bool)(~(auVar19._4_4_ == iVar22 && iVar20 < auVar19._0_4_ || iVar22 < auVar19._4_4_) &
                  1)) {
          local_678[uVar4] = uVar5 % (ulong)((int)uVar4 + 5);
        }
        if ((auVar19._12_4_ != iVar24 || auVar19._8_4_ <= iVar23) && auVar19._12_4_ <= iVar24) {
          local_678[uVar4 + 1] = uVar5 % (ulong)((int)uVar4 + 6);
        }
        uVar4 = uVar4 + 2;
        lVar18 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar4);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) goto LAB_00102f26;
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) goto LAB_00102f2f;
      iVar2 = cmp_msg((long *)local_678,local_358,n,(int)uVar5);
      if (iVar2 == 0) {
        return 1;
      }
      uVar8 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar8;
    } while (uVar8 != 0x54d);
    puts("test 2");
    uVar8 = 0;
    do {
      uVar5 = 0;
      auVar19 = _DAT_00106010;
      do {
        auVar21 = auVar19 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (ulong)uVar8 % (ulong)((int)uVar5 + 5);
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (ulong)uVar8 % (ulong)((int)uVar5 + 6);
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 2;
        auVar19._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) goto LAB_00102f26;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 100);
    uVar8 = 100;
    do {
      uVar5 = 0;
      auVar12 = _DAT_00106010;
      do {
        auVar21 = auVar12 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (long)(int)((uVar8 - 100) % ((int)uVar5 + 5U));
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (long)(int)((uVar8 - 100) % ((int)uVar5 + 6U));
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) goto LAB_00102f2f;
      iVar2 = cmp_msg((long *)local_678,local_358,n,uVar8);
      if (iVar2 == 0) {
        return 1;
      }
      uVar5 = 0;
      auVar13 = _DAT_00106010;
      do {
        auVar21 = auVar13 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (ulong)uVar8 % (ulong)((int)uVar5 + 5);
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (ulong)uVar8 % (ulong)((int)uVar5 + 6);
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) goto LAB_00102f26;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x4d2);
    iVar2 = Pm_QueueEmpty(q);
    if (iVar2 != 0) break;
    iVar2 = 0x4d2;
    do {
      uVar5 = 0;
      auVar14 = _DAT_00106010;
      do {
        auVar21 = auVar14 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (long)(int)((iVar2 - 100U) % ((int)uVar5 + 5U));
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (long)(int)((iVar2 - 100U) % ((int)uVar5 + 6U));
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) goto LAB_00102f2f;
      iVar3 = cmp_msg((long *)local_678,local_358,n,iVar2);
      if (iVar3 == 0) {
        return 1;
      }
      iVar2 = iVar2 + 1;
      iVar3 = Pm_QueueEmpty(q);
    } while (iVar3 == 0);
    if (iVar2 != 0x536) break;
    puts("test 3");
    uVar8 = 0;
    do {
      uVar5 = 0;
      auVar15 = _DAT_00106010;
      do {
        auVar21 = auVar15 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (ulong)uVar8 % (ulong)((int)uVar5 + 5);
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (ulong)uVar8 % (ulong)((int)uVar5 + 6);
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Enqueue(q,local_678);
    } while ((PVar1 != pmBufferOverflow) && (bVar10 = uVar8 < 0x6d, uVar8 = uVar8 + 1, bVar10));
    uVar8 = 0;
    do {
      uVar5 = 0;
      auVar16 = _DAT_00106010;
      do {
        auVar21 = auVar16 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (ulong)uVar8 % (ulong)((int)uVar5 + 5);
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (ulong)uVar8 % (ulong)((int)uVar5 + 6);
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) goto LAB_00102f2f;
      iVar2 = cmp_msg((long *)local_678,local_358,n,uVar8);
      if (iVar2 == 0) {
        return 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 100);
    PVar1 = Pm_Dequeue(q,local_358);
    if (PVar1 != pmBufferOverflow) {
      __s = "Pm_Dequeue overflow expected";
      goto LAB_00102f36;
    }
    puts("test 4");
    uVar8 = 0;
    do {
      uVar5 = 0;
      auVar17 = _DAT_00106010;
      do {
        auVar21 = auVar17 ^ _DAT_00106020;
        if ((bool)(~(auVar21._4_4_ == iVar22 && iVar20 < auVar21._0_4_ || iVar22 < auVar21._4_4_) &
                  1)) {
          local_678[uVar5] = (ulong)uVar8 % (ulong)((int)uVar5 + 5);
        }
        if ((auVar21._12_4_ != iVar24 || auVar21._8_4_ <= iVar23) && auVar21._12_4_ <= iVar24) {
          local_678[uVar5 + 1] = (ulong)uVar8 % (ulong)((int)uVar5 + 6);
        }
        uVar5 = uVar5 + 2;
        lVar18 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar18 + 2;
      } while (uVar6 != uVar5);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) goto LAB_00102f26;
      msg2_00 = (long *)Pm_QueuePeek(q);
      iVar2 = cmp_msg((long *)local_678,msg2_00,n,uVar8);
      if (iVar2 == 0) {
        return 1;
      }
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) goto LAB_00102f2f;
      iVar2 = cmp_msg((long *)local_678,local_358,n,uVar8);
      if (iVar2 == 0) {
        return 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x54d);
    Pm_QueueDestroy(q);
    uVar9 = uVar9 + 5;
    bVar10 = 0x5e < uVar7;
    uVar7 = uVar7 + 5;
    if (bVar10) {
      return 0;
    }
  }
  __s = "Message count error";
LAB_00102f36:
  puts(__s);
  return 1;
LAB_00102f26:
  __s = "Pm_Enqueue error";
  goto LAB_00102f36;
LAB_00102f2f:
  __s = "Pm_Dequeue error";
  goto LAB_00102f36;
}

Assistant:

int main()
{
    int msg_len;
    for (msg_len = 4; msg_len < 100; msg_len += 5) {
        PmQueue *queue = Pm_QueueCreate(100, msg_len * sizeof(long));
        int i;
        long msg[100];
        long msg2[100];

	printf("msg_len = %d\n", msg_len);
        if (!queue) {
            printf("Could not allocate queue\n");
            return 1;
        }
    
        /* insert/remove 1000 messages */
        printf("test 1\n");
        for (i = 0; i < 1357; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
    
        /* make full */
        printf("test 2\n");
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* alternately remove and insert */
        for (i = 100; i < 1234; i++) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* remove all */
        while (!Pm_QueueEmpty(queue)) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            i++;
        }
        if (i != 1334) {
            printf("Message count error\n");
	    return 1;
        }
    
        /* now test overflow */
        printf("test 3\n");
        for (i = 0; i < 110; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg) == pmBufferOverflow) {
	        break; /* this is supposed to execute after 100 messages */
            }
        }
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
		return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
	/* we should detect overflow after removing 100 messages */
        if (Pm_Dequeue(queue, msg2) != pmBufferOverflow) {
            printf("Pm_Dequeue overflow expected\n");
	    return 1;
        }
    
	/* after overflow is detected (and cleared), sender can
	 * send again
	 */
        /* see if function is restored, also test peek */
        printf("test 4\n");
        for (i = 0; i < 1357; i++) {
            long *peek;
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            peek = (long *) Pm_QueuePeek(queue);
            if (!cmp_msg(msg, peek, msg_len, i)) {
	        return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
	        return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
	        return 1;
            }
        }
        Pm_QueueDestroy(queue);
    }
    return 0;
}